

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_voter.hpp
# Opt level: O2

external_ip * __thiscall
libtorrent::aux::external_ip::operator=(external_ip *this,external_ip *param_1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  external_ip *peVar4;
  unsigned_long __i0;
  long lVar5;
  long lVar6;
  
  peVar4 = this;
  for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
    for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 0x20) {
      *(undefined8 *)((long)&(*(address (*) [2])*(address (*) [2])this)[0].type_ + lVar6) =
           *(undefined8 *)((long)&((address *)&(*(address (*) [2])param_1)[0].type_)->type_ + lVar6)
      ;
      puVar1 = (undefined8 *)
               ((long)&(*(address (*) [2])param_1)[0].ipv6_address_.addr_.__in6_u + lVar6);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)
               ((long)&(*(address (*) [2])*(address (*) [2])this)[0].ipv6_address_.addr_.__in6_u +
               lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      *(undefined8 *)
       ((long)&(*(address (*) [2])*(address (*) [2])this)[0].ipv6_address_.scope_id_ + lVar6) =
           *(undefined8 *)((long)&(*(address (*) [2])param_1)[0].ipv6_address_.scope_id_ + lVar6);
    }
    param_1 = (external_ip *)((long)param_1 + 0x40);
    this = (external_ip *)((long)this + 0x40);
  }
  return peVar4;
}

Assistant:

struct TORRENT_EXTRA_EXPORT external_ip
	{
		external_ip()
			: m_addresses{{address_v4(), address_v6()}, {address_v4(), address_v6()}}
		{}

		external_ip(address const& local4, address const& global4
			, address const& local6, address const& global6);

		// the external IP as it would be observed from `ip`
		address external_address(address const& ip) const;

	private:

		// support one local and one global address per address family
		// [0][n] = global [1][n] = local
		// [n][0] = IPv4 [n][1] = IPv6
		// TODO: 1 have one instance per possible subnet, 192.168.x.x, 10.x.x.x, etc.
		address m_addresses[2][2];
	}